

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_units.cpp
# Opt level: O2

void testBase(string *tempdir)

{
  int iVar1;
  ostream *poVar2;
  char **func;
  int local_34;
  int local_30;
  int local_2c;
  char *extra;
  
  func = &extra;
  exr_get_library_version(&local_2c,&local_30,&local_34);
  if (((local_2c == 3) && (local_30 == 4)) && (local_34 == 0)) {
    iVar1 = strcmp(extra,"-dev");
    if (iVar1 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Testing OpenEXR library version: \'");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_2c);
      poVar2 = std::operator<<(poVar2,".");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
      poVar2 = std::operator<<(poVar2,".");
      std::ostream::operator<<(poVar2,local_34);
      if (*extra != '\0') {
        std::operator<<((ostream *)&std::cout,extra);
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"\'");
      std::endl<char,std::char_traits<char>>(poVar2);
      exr_get_library_version(0,&local_30,&local_34,&extra);
      exr_get_library_version(&local_2c,0,&local_34,&extra);
      exr_get_library_version(&local_2c,&local_30,0,&extra);
      exr_get_library_version(&local_2c,&local_30,&local_34,0);
      return;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR testing library, wrong library version: \'")
  ;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_2c);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
  poVar2 = std::operator<<(poVar2,".");
  std::ostream::operator<<(poVar2,local_34);
  if (*extra != '\0') {
    std::operator<<((ostream *)&std::cerr,extra);
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"\' vs compiled in \'");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
  poVar2 = std::operator<<(poVar2,".");
  std::ostream::operator<<(poVar2,0);
  std::operator<<((ostream *)&std::cerr,"-dev");
  poVar2 = std::operator<<((ostream *)&std::cerr,"\'");
  std::endl<char,std::char_traits<char>>(poVar2);
  core_test_fail("false",(char *)0x2f,0x1540e4,(char *)func);
}

Assistant:

void
testBase (const std::string& tempdir)
{
    int         major, minor, patch;
    const char* extra;
    const char* compextra = COMP_EXTRA;

    exr_get_library_version (&major, &minor, &patch, &extra);
    if (major != COMP_MAJ || minor != COMP_MIN || patch != COMP_PATCH ||
        strcmp (extra, compextra))
    {
        std::cerr << "ERROR testing library, wrong library version: '" << major
                  << "." << minor << "." << patch;
        if (extra[0] != '\0') std::cerr << extra;
        std::cerr << "' vs compiled in '" << COMP_MAJ << "." << COMP_MIN << "."
                  << COMP_PATCH;
        if (compextra[0] != '\0') std::cerr << compextra;
        std::cerr << "'" << std::endl;
        EXRCORE_TEST (false);
    }
    std::cout << "Testing OpenEXR library version: '" << major << "." << minor
              << "." << patch;
    if (extra[0] != '\0') std::cout << extra;
    std::cout << "'" << std::endl;

    exr_get_library_version (NULL, &minor, &patch, &extra);
    exr_get_library_version (&major, NULL, &patch, &extra);
    exr_get_library_version (&major, &minor, NULL, &extra);
    exr_get_library_version (&major, &minor, &patch, NULL);

    major = (OPENEXR_VERSION_HEX >> 24) & 0xff;
    minor = (OPENEXR_VERSION_HEX >> 16) & 0xff;
    patch = (OPENEXR_VERSION_HEX >> 8) & 0xff;

    EXRCORE_TEST (major == COMP_MAJ);
    EXRCORE_TEST (minor == COMP_MIN);
    EXRCORE_TEST (patch == COMP_PATCH);

#if OPENEXR_VERSION_HEX > 0
    // confirm the macro compiles in an #if
#endif
}